

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caption.c
# Opt level: O0

size_t caption_frame_to_text(caption_frame_t *frame,utf8_char_t *data)

{
  int iVar1;
  utf8_char_t *c_00;
  size_t sVar2;
  undefined2 *in_RSI;
  utf8_char_t *chr;
  eia608_style_t sty;
  size_t size;
  size_t s;
  int count;
  int crlf;
  int uln;
  int c;
  int r;
  int *in_stack_ffffffffffffffc0;
  eia608_style_t *style;
  size_t in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar3;
  int local_20;
  int local_18;
  int local_14;
  undefined2 *local_10;
  
  local_20 = 0;
  iVar3 = 0;
  style = (eia608_style_t *)0x0;
  *(undefined1 *)in_RSI = 0;
  local_14 = 0;
  local_10 = in_RSI;
  do {
    if (0xe < local_14) {
      return (size_t)style;
    }
    local_20 = iVar3 + local_20;
    iVar3 = 0;
    for (local_18 = 0; local_18 < 0x20; local_18 = local_18 + 1) {
      c_00 = caption_frame_read_char
                       ((caption_frame_t *)CONCAT44(iVar3,in_stack_ffffffffffffffd8),
                        (int)(in_stack_ffffffffffffffd0 >> 0x20),(int)in_stack_ffffffffffffffd0,
                        style,in_stack_ffffffffffffffc0);
      sVar2 = utf8_char_length(c_00);
      if (sVar2 != 0) {
        if (iVar3 < 1) {
          iVar1 = utf8_char_whitespace(c_00);
          if (iVar1 != 0) goto LAB_00117f0a;
        }
        if (0 < local_20) {
          *local_10 = 0xa0d;
          *(undefined1 *)(local_10 + 1) = 0;
          local_10 = local_10 + 1;
          style = (eia608_style_t *)((long)style + 2);
          local_20 = 0;
        }
        in_stack_ffffffffffffffd0 = utf8_char_copy((utf8_char_t *)in_stack_ffffffffffffffc0,c_00);
        local_10 = (undefined2 *)(in_stack_ffffffffffffffd0 + (long)local_10);
        style = (eia608_style_t *)(in_stack_ffffffffffffffd0 + (long)style);
        iVar3 = iVar3 + 1;
      }
LAB_00117f0a:
    }
    local_14 = local_14 + 1;
  } while( true );
}

Assistant:

size_t caption_frame_to_text(caption_frame_t* frame, utf8_char_t* data)
{
    int r, c, uln, crlf = 0, count = 0;
    size_t s, size = 0;
    eia608_style_t sty;
    (*data) = '\0';

    for (r = 0; r < SCREEN_ROWS; ++r) {
        crlf += count, count = 0;
        for (c = 0; c < SCREEN_COLS; ++c) {
            const utf8_char_t* chr = caption_frame_read_char(frame, r, c, &sty, &uln);
            // dont start a new line until we encounter at least one printable character
            if (0 < utf8_char_length(chr) && (0 < count || !utf8_char_whitespace(chr))) {
                if (0 < crlf) {
                    memcpy(data, "\r\n\0", 3);
                    data += 2, size += 2, crlf = 0;
                }

                s = utf8_char_copy(data, chr);
                data += s, size += s, ++count;
            }
        }
    }

    return size;
}